

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_head_single.h
# Opt level: O2

bool __thiscall
density::detail::
LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
::Consume::advance_head(Consume *this)

{
  ControlBlock *pCVar1;
  ControlBlock *pCVar2;
  ulong uVar3;
  uintptr_t uint_pointer_1;
  ControlBlock *i_atomic;
  ulong uVar4;
  
  pCVar1 = this->m_control;
  pCVar2 = this->m_queue->m_head;
  if (pCVar2 == pCVar1) {
    uVar3 = this->m_next_ptr;
    this->m_queue->m_head = (ControlBlock *)(uVar3 & 0xfffffffffffffff0);
    i_atomic = pCVar1;
    if ((uVar3 & 4) != 0) {
      aligned_deallocate((void *)pCVar2[3].m_next,pCVar2[4].m_next,pCVar2[5].m_next,0);
      i_atomic = this->m_control;
    }
    uVar4 = uVar3 ^ (ulong)i_atomic;
    if (((uVar3 & 0xfff0) == 0) == uVar4 < 0x10000) {
      density_tests::detail::assert_failed<>
                ("is_same_page != address_is_aligned(next, ALLOCATOR_TYPE::page_alignment)",
                 "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_head_single.h"
                 ,0x119);
      i_atomic = this->m_control;
    }
    if ((i_atomic == (ControlBlock *)((ulong)i_atomic & 0xffffffffffff0000 | 0xffc0)) ==
        uVar4 < 0x10000) {
      density_tests::detail::assert_failed<>
                ("!ConstConditional(Base::s_needs_end_control) || is_same_page == (m_control != Base::get_end_control_block(m_control))"
                 ,
                 "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_head_single.h"
                 ,0x11c);
      i_atomic = this->m_control;
    }
    raw_atomic_store(&i_atomic->m_next,0,memory_order_seq_cst);
    if (uVar4 < 0x10000) {
      memset(this->m_control + 1,0,(long)(uVar3 & 0xfffffffffffffff0) - (long)(this->m_control + 1))
      ;
    }
    else {
      basic_default_allocator<65536UL>::deallocate_page_zeroed
                ((basic_default_allocator<65536UL> *)this->m_queue,this->m_control);
    }
  }
  return pCVar2 == pCVar1;
}

Assistant:

bool advance_head()
                {
                    auto next = reinterpret_cast<ControlBlock *>(m_next_ptr & ~LfQueue_AllFlags);

                    if (m_queue->m_head == m_control)
                    {
                        m_queue->m_head = next;
                        if (m_next_ptr & LfQueue_External)
                        {
                            auto const external_block = static_cast<ExternalBlock *>(
                              address_add(m_control, Base::s_element_min_offset));
                            m_queue->ALLOCATOR_TYPE::deallocate(
                              external_block->m_block,
                              external_block->m_size,
                              external_block->m_alignment);
                        }

                        bool const is_same_page = Base::same_page(m_control, next);
                        DENSITY_ASSERT_INTERNAL(
                          is_same_page != address_is_aligned(next, ALLOCATOR_TYPE::page_alignment));
                        DENSITY_ASSERT_INTERNAL(
                          !ConstConditional(Base::s_needs_end_control) ||
                          is_same_page == (m_control != Base::get_end_control_block(m_control)));

                        static_assert(offsetof(ControlBlock, m_next) == 0, "");

                        if (Base::s_deallocate_zeroed_pages)
                        {
                            raw_atomic_store(&m_control->m_next, uintptr_t(0));
                        }

                        if (is_same_page)
                        {
                            if (Base::s_deallocate_zeroed_pages)
                            {
                                auto const memset_dest =
                                  const_cast<uintptr_t *>(&m_control->m_next) + 1;
                                auto const memset_size = address_diff(next, memset_dest);
                                DENSITY_ASSUME_ALIGNED(memset_dest, alignof(uintptr_t));
                                DENSITY_ASSUME_UINT_ALIGNED(memset_size, alignof(uintptr_t));
                                std::memset(memset_dest, 0, memset_size);
                            }
                        }
                        else
                        {
                            if (Base::s_deallocate_zeroed_pages)
                                m_queue->ALLOCATOR_TYPE::deallocate_page_zeroed(m_control);
                            else
                                m_queue->ALLOCATOR_TYPE::deallocate_page(m_control);
                        }
                        return true;
                    }
                    else
                    {
                        return false;
                    }
                }